

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_font_atlas_init_default(nk_font_atlas *atlas)

{
  nk_font_atlas *atlas_local;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x342a,"void nk_font_atlas_init_default(struct nk_font_atlas *)");
  }
  if (atlas != (nk_font_atlas *)0x0) {
    nk_zero(atlas,400);
    (atlas->temporary).userdata.ptr = (void *)0x0;
    (atlas->temporary).alloc = nk_malloc;
    (atlas->temporary).free = nk_mfree;
    (atlas->permanent).userdata.ptr = (void *)0x0;
    (atlas->permanent).alloc = nk_malloc;
    (atlas->permanent).free = nk_mfree;
  }
  return;
}

Assistant:

NK_API void
nk_font_atlas_init_default(struct nk_font_atlas *atlas)
{
    NK_ASSERT(atlas);
    if (!atlas) return;
    nk_zero_struct(*atlas);
    atlas->temporary.userdata.ptr = 0;
    atlas->temporary.alloc = nk_malloc;
    atlas->temporary.free = nk_mfree;
    atlas->permanent.userdata.ptr = 0;
    atlas->permanent.alloc = nk_malloc;
    atlas->permanent.free = nk_mfree;
}